

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
cmsys::CommandLineArguments::Initialize(CommandLineArguments *this,int argc,char **argv)

{
  String local_48;
  int local_24;
  char **ppcStack_20;
  int cc;
  char **argv_local;
  CommandLineArguments *pCStack_10;
  int argc_local;
  CommandLineArguments *this_local;
  
  ppcStack_20 = argv;
  argv_local._4_4_ = argc;
  pCStack_10 = this;
  Initialize(this);
  String::String(&local_48,*ppcStack_20);
  String::operator=(&this->Internals->Argv0,&local_48);
  String::~String(&local_48);
  for (local_24 = 1; local_24 < argv_local._4_4_; local_24 = local_24 + 1) {
    ProcessArgument(this,ppcStack_20[local_24]);
  }
  return;
}

Assistant:

void CommandLineArguments::Initialize(int argc, const char* const argv[])
{
  int cc;

  this->Initialize();
  this->Internals->Argv0 = argv[0];
  for (cc = 1; cc < argc; cc++) {
    this->ProcessArgument(argv[cc]);
  }
}